

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer-spec.cc
# Opt level: O3

void __thiscall
wabt::anon_unknown_1::BinaryWriterSpec::WriteF32
          (BinaryWriterSpec *this,uint32_t f32_bits,ExpectedNan expected)

{
  char *pcVar1;
  
  if (expected == Arithmetic) {
    pcVar1 = "nan:arithmetic";
  }
  else {
    if (expected != Canonical) {
      if (expected == None) {
        Stream::Writef((Stream *)this,"\"%u\"",f32_bits);
        return;
      }
      return;
    }
    pcVar1 = "nan:canonical";
  }
  Stream::Writef((Stream *)this,"\"%s\"",pcVar1);
  return;
}

Assistant:

void BinaryWriterSpec::WriteF32(uint32_t f32_bits, ExpectedNan expected) {
  switch (expected) {
    case ExpectedNan::None:
      json_stream_->Writef("\"%u\"", f32_bits);
      break;

    case ExpectedNan::Arithmetic:
      WriteString("nan:arithmetic");
      break;

    case ExpectedNan::Canonical:
      WriteString("nan:canonical");
      break;
  }
}